

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> * __thiscall
nonius::
filter_benchmarks<__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>
          (vector<nonius::benchmark,_std::allocator<nonius::benchmark>_> *__return_storage_ptr__,
          nonius *this,
          __normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
          first,__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
                last,string *pattern)

{
  regex matcher;
  
  (__return_storage_ptr__->super__Vector_base<nonius::benchmark,_std::allocator<nonius::benchmark>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<nonius::benchmark,_std::allocator<nonius::benchmark>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<nonius::benchmark,_std::allocator<nonius::benchmark>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&matcher,&(last._M_current)->name
             ,0x10);
  std::
  copy_if<__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,std::back_insert_iterator<std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,nonius::filter_benchmarks<__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>>(__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,__gnu_cxx::__normal_iterator<nonius::benchmark*,std::vector<nonius::benchmark,std::allocator<nonius::benchmark>>>,std::__cxx11::string)::_lambda(nonius::benchmark_const&)_1_>
            ((__normal_iterator<nonius::benchmark_*,_std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
              )this,first,
             (back_insert_iterator<std::vector<nonius::benchmark,_std::allocator<nonius::benchmark>_>_>
              )__return_storage_ptr__,&matcher);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&matcher);
  return __return_storage_ptr__;
}

Assistant:

std::vector<benchmark> filter_benchmarks(Iterator first, Iterator last, std::string pattern) {
        auto r = std::vector<benchmark>{};
        auto matcher = std::regex{pattern};
        std::copy_if(first, last, std::back_inserter(r), [&] (benchmark const& b) {
            return std::regex_match(b.name, matcher);
        });
        return r;
    }